

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O2

void __thiscall
so_5::disp::prio_one_thread::quoted_round_robin::impl::
dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::no_activity_tracking_impl_t>_>
::dispatcher_template_t
          (dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::no_activity_tracking_impl_t>_>
           *this,quotes_t *quotes,disp_params_t *params)

{
  long *in_RAX;
  pointer *__ptr;
  lock_unique_ptr_t local_28;
  
  local_28._M_t.
  super___uniq_ptr_impl<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
  .super__Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false>._M_head_impl =
       (__uniq_ptr_data<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>,_true,_true>
        )(__uniq_ptr_data<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>,_true,_true>
          )in_RAX;
  actual_disp_iface_t::actual_disp_iface_t(&this->super_actual_disp_iface_t);
  (this->super_actual_disp_iface_t).super_dispatcher_t._vptr_dispatcher_t =
       (_func_int **)&PTR__dispatcher_template_t_002cbd18;
  std::
  function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
  ::operator()((function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
                *)&local_28);
  demand_queue_t::demand_queue_t(&this->m_demand_queue,&local_28,quotes);
  if (local_28._M_t.
      super___uniq_ptr_impl<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
      ._M_t.
      super__Tuple_impl<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
      .super__Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
       )0x0) {
    (**(code **)(*(long *)local_28._M_t.
                          super___uniq_ptr_impl<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
                          .super__Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false>.
                          _M_head_impl + 8))();
  }
  local_28._M_t.
  super___uniq_ptr_impl<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
  .super__Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false>._M_head_impl =
       (__uniq_ptr_data<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>,_true,_true>
        )(__uniq_ptr_impl<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
          )0x0;
  (this->m_work_thread).
  super_with_activity_tracking_impl_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>
  .super_common_data_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>.m_queue
       = (demand_queue_t *)&this->m_demand_queue;
  (this->m_work_thread).
  super_with_activity_tracking_impl_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>
  .super_common_data_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>.m_thread
  ._M_id._M_thread = 0;
  (this->m_work_thread).
  super_with_activity_tracking_impl_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>
  .super_common_data_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>.
  m_thread_id._M_thread = 0;
  disp_data_source_t::disp_data_source_t
            ((disp_data_source_t *)
             &(this->m_work_thread).
              super_with_activity_tracking_impl_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>
              .m_working_stats,this);
  return;
}

Assistant:

dispatcher_template_t(
			const quotes_t & quotes,
			disp_params_t params )
			:	m_demand_queue{
					params.queue_params().lock_factory()(),
					quotes }
			,	m_work_thread{ m_demand_queue }
			,	m_data_source{ self() }
			{}